

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O0

void slang::SFormat::formatFloat(string *result,double value,char specifier,FormatOptions *options)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  long lVar4;
  pointer pcVar5;
  long lVar6;
  size_t sz;
  size_t cur;
  char local_49;
  undefined1 local_48 [8];
  SmallVector<char,_8UL> fmt;
  FormatOptions *options_local;
  double dStack_18;
  char specifier_local;
  double value_local;
  string *result_local;
  
  fmt.super_SmallVectorBase<char>._24_8_ = options;
  options_local._7_1_ = specifier;
  dStack_18 = value;
  value_local = (double)result;
  SmallVector<char,_8UL>::SmallVector((SmallVector<char,_8UL> *)local_48);
  local_49 = '%';
  SmallVectorBase<char>::push_back((SmallVectorBase<char> *)local_48,&local_49);
  if ((*(byte *)(fmt.super_SmallVectorBase<char>._24_8_ + 0x10) & 1) != 0) {
    cur._3_1_ = 0x2d;
    SmallVectorBase<char>::push_back((SmallVectorBase<char> *)local_48,(char *)((long)&cur + 3));
  }
  if ((*(byte *)(fmt.super_SmallVectorBase<char>._24_8_ + 0x11) & 1) != 0) {
    cur._2_1_ = 0x30;
    SmallVectorBase<char>::push_back((SmallVectorBase<char> *)local_48,(char *)((long)&cur + 2));
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)fmt.super_SmallVectorBase<char>._24_8_);
  if (bVar1) {
    puVar3 = std::optional<unsigned_int>::operator*
                       ((optional<unsigned_int> *)fmt.super_SmallVectorBase<char>._24_8_);
    uintToStr((SmallVectorBase<char> *)local_48,*puVar3);
  }
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)(fmt.super_SmallVectorBase<char>._24_8_ + 8));
  if (bVar1) {
    cur._1_1_ = 0x2e;
    SmallVectorBase<char>::push_back((SmallVectorBase<char> *)local_48,(char *)((long)&cur + 1));
    puVar3 = std::optional<unsigned_int>::operator*
                       ((optional<unsigned_int> *)(fmt.super_SmallVectorBase<char>._24_8_ + 8));
    uintToStr((SmallVectorBase<char> *)local_48,*puVar3);
  }
  SmallVectorBase<char>::push_back
            ((SmallVectorBase<char> *)local_48,(char *)((long)&options_local + 7));
  cur._0_1_ = 0;
  SmallVectorBase<char>::push_back((SmallVectorBase<char> *)local_48,(char *)&cur);
  lVar4 = std::__cxx11::string::size();
  pcVar5 = SmallVectorBase<char>::data((SmallVectorBase<char> *)local_48);
  iVar2 = snprintf((char *)0x0,0,pcVar5,dStack_18);
  std::__cxx11::string::resize((ulong)value_local);
  lVar6 = std::__cxx11::string::data();
  pcVar5 = SmallVectorBase<char>::data((SmallVectorBase<char> *)local_48);
  snprintf((char *)(lVar6 + lVar4),(long)iVar2 + 1,pcVar5,dStack_18);
  std::__cxx11::string::pop_back();
  SmallVector<char,_8UL>::~SmallVector((SmallVector<char,_8UL> *)local_48);
  return;
}

Assistant:

static void formatFloat(std::string& result, double value, char specifier,
                        const FormatOptions& options) {
    SmallVector<char, 8> fmt;
    fmt.push_back('%');
    if (options.leftJustify)
        fmt.push_back('-');
    if (options.zeroPad)
        fmt.push_back('0');
    if (options.width)
        uintToStr(fmt, *options.width);
    if (options.precision) {
        fmt.push_back('.');
        uintToStr(fmt, *options.precision);
    }
    fmt.push_back(specifier);
    fmt.push_back('\0');

    size_t cur = result.size();
    size_t sz = (size_t)snprintf(nullptr, 0, fmt.data(), value);
    result.resize(cur + sz + 1);
    snprintf(result.data() + cur, sz + 1, fmt.data(), value);
    result.pop_back();
}